

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O1

void Abc_NtkMultiSetBounds(Abc_Ntk_t *pNtk,int nThresh,int nFaninMax)

{
  uint *puVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *vCone;
  void **ppvVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  
  vCone = (Vec_Ptr_t *)malloc(0x10);
  vCone->nCap = 10;
  vCone->nSize = 0;
  ppvVar6 = (void **)malloc(0x50);
  vCone->pArray = ppvVar6;
  lVar7 = (long)pNtk->vObjs->nSize;
  if (0 < lVar7) {
    lVar9 = 0;
    do {
      pvVar2 = pNtk->vObjs->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && ((*(byte *)((long)pvVar2 + 0x14) & 0x10) != 0)) {
        __assert_fail("pNode->fMarkA == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                      ,0x18c,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar7];
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        iVar5 = (pAVar3->vFanouts).nSize;
        iVar4 = Abc_NodeMffcSize(pAVar3);
        if (nThresh < (iVar5 + -1) * iVar4) {
          pAVar3->field_0x14 = pAVar3->field_0x14 | 0x10;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      puVar1 = (uint *)(*(long *)(*(long *)(*(long *)(*pVVar8->pArray[lVar7] + 0x20) + 8) +
                                 (long)**(int **)((long)pVVar8->pArray[lVar7] + 0x20) * 8) + 0x14);
      *puVar1 = *puVar1 | 0x10;
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pVVar8->pArray[lVar7];
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0x1f) == 0x17)) {
        do {
          vCone->nSize = 0;
          iVar5 = Abc_NtkMultiLimit_rec(pAVar3,vCone,nFaninMax,1,1);
        } while (iVar5 != 0);
        if (nFaninMax < vCone->nSize) {
          __assert_fail("vCone->nSize <= nFaninMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                        ,0x1a9,"void Abc_NtkMultiSetBounds(Abc_Ntk_t *, int, int)");
        }
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  if (vCone->pArray != (void **)0x0) {
    free(vCone->pArray);
    vCone->pArray = (void **)0x0;
  }
  free(vCone);
  return;
}

Assistant:

void Abc_NtkMultiSetBounds( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax )
{
    Vec_Ptr_t * vCone = Vec_PtrAlloc(10);
    Abc_Obj_t * pNode;
    int i, nFanouts, nConeSize;

    // make sure the mark is not set
    Abc_NtkForEachObj( pNtk, pNode, i )
        assert( pNode->fMarkA == 0 );

    // mark the nodes where expansion stops using pNode->fMarkA
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // mark the nodes with multiple fanouts
        nFanouts = Abc_ObjFanoutNum(pNode);
        nConeSize = Abc_NodeMffcSize(pNode);
        if ( (nFanouts - 1) * nConeSize > nThresh )
            pNode->fMarkA = 1;
    }

    // mark the PO drivers
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_ObjFanin0(pNode)->fMarkA = 1;

    // make sure the fanin limit is met
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        if ( pNode->fMarkA == 0 )
            continue;
        // continue cutting branches until it meets the fanin limit
        while ( Abc_NtkMultiLimit(pNode, vCone, nFaninMax) );
        assert( vCone->nSize <= nFaninMax );  
    }
    Vec_PtrFree(vCone);
/*
    // make sure the fanin limit is met
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip PI/PO nodes
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        if ( pNode->fMarkA == 0 )
            continue;
        Abc_NtkMultiCone( pNode, vCone );
        assert( vCone->nSize <= nFaninMax );    
    }
*/
}